

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void solvegoto(LexState *ls,int g,Labeldesc *label)

{
  Dyndata *pDVar1;
  int iVar2;
  lu_byte lVar3;
  undefined6 uVar4;
  Labellist *pLVar5;
  Labeldesc *pLVar6;
  Labeldesc *pLVar7;
  Labeldesc *gt;
  Labellist *gl;
  int i;
  Labeldesc *label_local;
  int g_local;
  LexState *ls_local;
  
  pDVar1 = ls->dyd;
  pLVar5 = &pDVar1->gt;
  pLVar6 = pLVar5->arr + g;
  if (pLVar6->nactvar < label->nactvar) {
    jumpscopeerror(ls,pLVar6);
  }
  luaK_patchlist(ls->fs,pLVar6->pc,label->pc);
  for (gl._4_4_ = g; gl._4_4_ < (pDVar1->gt).n + -1; gl._4_4_ = gl._4_4_ + 1) {
    pLVar6 = pLVar5->arr + gl._4_4_;
    pLVar7 = pLVar5->arr + (gl._4_4_ + 1);
    pLVar6->name = pLVar7->name;
    iVar2 = pLVar7->line;
    pLVar6->pc = pLVar7->pc;
    pLVar6->line = iVar2;
    lVar3 = pLVar7->close;
    uVar4 = *(undefined6 *)&pLVar7->field_0x12;
    pLVar6->nactvar = pLVar7->nactvar;
    pLVar6->close = lVar3;
    *(undefined6 *)&pLVar6->field_0x12 = uVar4;
  }
  (pDVar1->gt).n = (pDVar1->gt).n + -1;
  return;
}

Assistant:

static void solvegoto (LexState *ls, int g, Labeldesc *label) {
  int i;
  Labellist *gl = &ls->dyd->gt;  /* list of gotos */
  Labeldesc *gt = &gl->arr[g];  /* goto to be resolved */
  lua_assert(eqstr(gt->name, label->name));
  if (l_unlikely(gt->nactvar < label->nactvar))  /* enter some scope? */
    jumpscopeerror(ls, gt);
  luaK_patchlist(ls->fs, gt->pc, label->pc);
  for (i = g; i < gl->n - 1; i++)  /* remove goto from pending list */
    gl->arr[i] = gl->arr[i + 1];
  gl->n--;
}